

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O1

int run_test_tcp_ref3(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  undefined8 uVar3;
  void **unaff_RBX;
  uv_connect_t *puVar4;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_tcp_t h;
  undefined1 auStack_648 [16];
  undefined1 auStack_638 [16];
  undefined8 auStack_628 [23];
  long alStack_570 [41];
  code *pcStack_428;
  long lStack_418;
  long lStack_410;
  undefined1 auStack_408 [16];
  long alStack_3f8 [23];
  code *pcStack_340;
  long lStack_330;
  long lStack_328;
  undefined1 auStack_320 [184];
  uv_connect_t *puStack_268;
  undefined8 uStack_258;
  long lStack_250;
  undefined1 auStack_248 [16];
  void **ppvStack_238;
  uv_connect_t auStack_220 [2];
  void **ppvStack_128;
  undefined8 uStack_118;
  code *pcStack_110;
  uv_connect_t local_100 [2];
  
  pcStack_110 = (code *)0x1b93dc;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_100[0].type);
  local_100[0].reserved[1] = (void *)(long)iVar1;
  local_100[0].data = (uv_loop_t *)0x0;
  if (local_100[0].reserved[1] == (void *)0x0) {
    pcStack_110 = (code *)0x1b9401;
    uVar2 = uv_default_loop();
    unaff_RBX = local_100[0].reserved + 1;
    pcStack_110 = (code *)0x1b9411;
    uv_tcp_init(uVar2,unaff_RBX);
    pcStack_110 = (code *)0x1b942c;
    uv_tcp_connect(&connect_req,unaff_RBX,&local_100[0].type,connect_and_shutdown);
    pcStack_110 = (code *)0x1b9434;
    uv_unref(unaff_RBX);
    pcStack_110 = (code *)0x1b9439;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b9443;
    uv_run(uVar2,0);
    local_100[0].data = (uv_loop_t *)0x1;
    local_100[0].loop = (uv_loop_t *)(long)connect_cb_called;
    if (local_100[0].loop != (uv_loop_t *)0x1) goto LAB_001b9502;
    local_100[0].data = (uv_loop_t *)0x1;
    local_100[0].loop = (uv_loop_t *)(long)shutdown_cb_called;
    if (local_100[0].loop != (uv_loop_t *)0x1) goto LAB_001b9511;
    pcStack_110 = (code *)0x1b9497;
    do_close(local_100[0].reserved + 1);
    pcStack_110 = (code *)0x1b949c;
    unaff_RBX = (void **)uv_default_loop();
    pcStack_110 = (code *)0x1b94b0;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x1b94ba;
    uv_run(unaff_RBX,0);
    local_100[0].data = (uv_loop_t *)0x0;
    pcStack_110 = (code *)0x1b94c8;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b94d0;
    iVar1 = uv_loop_close(uVar2);
    local_100[0].loop = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)local_100[0].data == local_100[0].loop) {
      pcStack_110 = (code *)0x1b94e8;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1b9502;
    run_test_tcp_ref3_cold_1();
LAB_001b9502:
    pcStack_110 = (code *)0x1b9511;
    run_test_tcp_ref3_cold_2();
LAB_001b9511:
    pcStack_110 = (code *)0x1b9520;
    run_test_tcp_ref3_cold_3();
  }
  puVar4 = local_100;
  iVar1 = (int)local_100 + 8;
  pcStack_110 = connect_and_shutdown;
  run_test_tcp_ref3_cold_4();
  if (puVar4 == &connect_req) {
    pcStack_110 = (code *)(long)iVar1;
    uStack_118 = 0;
    if (pcStack_110 == (code *)0x0) {
      ppvStack_128 = (void **)0x1b9576;
      iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
      connect_cb_called = connect_cb_called + 1;
      return iVar1;
    }
  }
  else {
    ppvStack_128 = (void **)0x1b9586;
    connect_and_shutdown_cold_1();
  }
  ppvStack_128 = (void **)run_test_tcp_ref4;
  connect_and_shutdown_cold_2();
  ppvStack_128 = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&auStack_220[0].type);
  auStack_220[0].reserved[1] = (void *)(long)iVar1;
  auStack_220[0].data = (uv_loop_t *)0x0;
  if (auStack_220[0].reserved[1] == (void *)0x0) {
    uVar2 = uv_default_loop();
    unaff_RBX = auStack_220[0].reserved + 1;
    uv_tcp_init(uVar2,unaff_RBX);
    uv_tcp_connect(&connect_req,unaff_RBX,&auStack_220[0].type,connect_and_write);
    uv_unref(unaff_RBX);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    auStack_220[0].data = (uv_loop_t *)0x1;
    auStack_220[0].loop = (uv_loop_t *)(long)connect_cb_called;
    if (auStack_220[0].loop != (uv_loop_t *)0x1) goto LAB_001b96fe;
    auStack_220[0].data = (uv_loop_t *)0x1;
    auStack_220[0].loop = (uv_loop_t *)(long)write_cb_called;
    if (auStack_220[0].loop != (uv_loop_t *)0x1) goto LAB_001b970d;
    auStack_220[0].data = (uv_loop_t *)0x1;
    auStack_220[0].loop = (uv_loop_t *)(long)shutdown_cb_called;
    if (auStack_220[0].loop != (uv_loop_t *)0x1) goto LAB_001b971c;
    do_close(auStack_220[0].reserved + 1);
    unaff_RBX = (void **)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    auStack_220[0].data = (uv_loop_t *)0x0;
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    auStack_220[0].loop = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_220[0].data == auStack_220[0].loop) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_ref4_cold_1();
LAB_001b96fe:
    run_test_tcp_ref4_cold_2();
LAB_001b970d:
    run_test_tcp_ref4_cold_3();
LAB_001b971c:
    run_test_tcp_ref4_cold_4();
  }
  puVar4 = auStack_220;
  iVar1 = (int)auStack_220 + 8;
  run_test_tcp_ref4_cold_5();
  puStack_268 = (uv_connect_t *)0x1b9756;
  ppvStack_238 = unaff_RBX;
  auStack_248 = uv_buf_init(buffer,0x7fff);
  if (puVar4 == &connect_req) {
    lStack_250 = (long)iVar1;
    uStack_258 = 0;
    if (lStack_250 == 0) {
      puStack_268 = (uv_connect_t *)0x1b97ad;
      iVar1 = uv_write(&write_req,connect_req.handle,auStack_248,1,write_cb);
      connect_cb_called = connect_cb_called + 1;
      return iVar1;
    }
  }
  else {
    puStack_268 = (uv_connect_t *)0x1b97c2;
    connect_and_write_cold_1();
  }
  puStack_268 = (uv_connect_t *)run_test_udp_ref;
  connect_and_write_cold_2();
  pcStack_340 = (code *)0x1b97de;
  puStack_268 = puVar4;
  uVar2 = uv_default_loop();
  pcStack_340 = (code *)0x1b97ee;
  uv_udp_init(uVar2,auStack_320);
  pcStack_340 = (code *)0x1b97f6;
  uv_unref(auStack_320);
  pcStack_340 = (code *)0x1b97fb;
  uVar2 = uv_default_loop();
  pcStack_340 = (code *)0x1b9805;
  uv_run(uVar2,0);
  pcStack_340 = (code *)0x1b980d;
  do_close(auStack_320);
  pcStack_340 = (code *)0x1b9812;
  uVar3 = uv_default_loop();
  pcStack_340 = (code *)0x1b9826;
  uv_walk(uVar3,close_walk_cb,0);
  pcStack_340 = (code *)0x1b9830;
  uv_run(uVar3,0);
  lStack_328 = 0;
  pcStack_340 = (code *)0x1b983e;
  uVar2 = uv_default_loop();
  pcStack_340 = (code *)0x1b9846;
  iVar1 = uv_loop_close(uVar2);
  lStack_330 = (long)iVar1;
  if (lStack_328 == lStack_330) {
    pcStack_340 = (code *)0x1b985e;
    uv_library_shutdown();
    return 0;
  }
  pcStack_340 = run_test_udp_ref2;
  run_test_udp_ref_cold_1();
  pcStack_428 = (code *)0x1b9896;
  pcStack_340 = (code *)uVar3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_408);
  alStack_3f8[0] = (long)iVar1;
  lStack_418 = 0;
  if (alStack_3f8[0] == 0) {
    pcStack_428 = (code *)0x1b98bb;
    uVar2 = uv_default_loop();
    pcStack_428 = (code *)0x1b98cb;
    uv_udp_init(uVar2,alStack_3f8);
    pcStack_428 = (code *)0x1b98da;
    uv_udp_bind(alStack_3f8,auStack_408,0);
    pcStack_428 = (code *)0x1b98ec;
    uv_udp_recv_start(alStack_3f8,fail_cb);
    pcStack_428 = (code *)0x1b98f4;
    uv_unref(alStack_3f8);
    pcStack_428 = (code *)0x1b98f9;
    uVar2 = uv_default_loop();
    pcStack_428 = (code *)0x1b9903;
    uv_run(uVar2,0);
    pcStack_428 = (code *)0x1b990b;
    do_close(alStack_3f8);
    pcStack_428 = (code *)0x1b9910;
    uVar3 = uv_default_loop();
    pcStack_428 = (code *)0x1b9924;
    uv_walk(uVar3,close_walk_cb,0);
    pcStack_428 = (code *)0x1b992e;
    uv_run(uVar3,0);
    lStack_418 = 0;
    pcStack_428 = (code *)0x1b993c;
    uVar2 = uv_default_loop();
    pcStack_428 = (code *)0x1b9944;
    iVar1 = uv_loop_close(uVar2);
    lStack_410 = (long)iVar1;
    if (lStack_418 == lStack_410) {
      pcStack_428 = (code *)0x1b995c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_428 = (code *)0x1b9976;
    run_test_udp_ref2_cold_1();
  }
  pcStack_428 = run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  pcStack_428 = (code *)uVar3;
  auStack_648 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_638);
  alStack_570[0] = (long)iVar1;
  auStack_628[0] = 0;
  if (alStack_570[0] == 0) {
    uVar2 = uv_default_loop();
    uv_udp_init(uVar2,auStack_628);
    uv_udp_send(alStack_570,auStack_628,auStack_648,1,auStack_638,req_cb);
    uv_unref(auStack_628);
    uVar2 = uv_default_loop();
    uv_run(uVar2,0);
    if (req_cb_called == 1) {
      do_close(auStack_628);
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b9ad8;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001b9ad8:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_ref3) {
  struct sockaddr_in addr;
  uv_tcp_t h;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_tcp_init(uv_default_loop(), &h);
  uv_tcp_connect(&connect_req,
                 &h,
                 (const struct sockaddr*) &addr,
                 connect_and_shutdown);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}